

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O0

void __thiscall HRSS_Basic_Test::TestBody(HRSS_Basic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_2830;
  Message local_2828;
  Span<const_unsigned_char> local_2820;
  Bytes local_2810;
  Span<const_unsigned_char> local_2800;
  Bytes local_27f0;
  undefined1 local_27e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_27b0;
  Message local_27a8;
  int local_279c;
  undefined1 local_2798 [8];
  AssertionResult gtest_ar__3;
  uint8_t shared_key2 [32];
  string local_2760;
  AssertHelper local_2740;
  Message local_2738;
  int local_272c;
  undefined1 local_2728 [8];
  AssertionResult gtest_ar__2;
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  AssertHelper local_2260;
  Message local_2258;
  int local_224c;
  undefined1 local_2248 [8];
  AssertionResult gtest_ar__1;
  uint8_t pub_bytes [1138];
  undefined1 local_1dbc [8];
  HRSS_public_key pub2;
  uint i_1;
  uint8_t encap_entropy [1400];
  string local_12a8;
  AssertHelper local_1288;
  Message local_1280 [3];
  int local_1264;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar_;
  HRSS_private_key priv;
  HRSS_public_key pub;
  uint i;
  uint8_t generate_key_entropy [1432];
  HRSS_Basic_Test *this_local;
  
  pub.opaque[0x588] = '\0';
  pub.opaque[0x589] = '\0';
  pub.opaque[0x58a] = '\0';
  pub.opaque[0x58b] = '\0';
  for (; (uint)pub.opaque._1416_4_ < 0x598; pub.opaque._1416_4_ = pub.opaque._1416_4_ + 1) {
    pub.opaque[(ulong)(uint)pub.opaque._1416_4_ + 0x58c] = pub.opaque[0x588];
  }
  local_1264 = HRSS_generate_key((HRSS_public_key *)(priv.opaque + 0x708),
                                 (HRSS_private_key *)
                                 ((long)&gtest_ar_.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 4),pub.opaque + 0x58c);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_1260,&local_1264,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1260);
  if (!bVar1) {
    testing::Message::Message(local_1280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_12a8,(internal *)local_1260,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1288,local_1280);
    testing::internal::AssertHelper::~AssertHelper(&local_1288);
    std::__cxx11::string::~string((string *)&local_12a8);
    testing::Message::~Message(local_1280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1260);
  if (bVar1) {
    pub2.opaque[0x588] = '\0';
    pub2.opaque[0x589] = '\0';
    pub2.opaque[0x58a] = '\0';
    pub2.opaque[0x58b] = '\0';
    for (; (uint)pub2.opaque._1416_4_ < 0x578; pub2.opaque._1416_4_ = pub2.opaque._1416_4_ + 1) {
      pub2.opaque[(ulong)(uint)pub2.opaque._1416_4_ + 0x58c] = pub2.opaque[0x588];
    }
    HRSS_marshal_public_key
              ((uint8_t *)&gtest_ar__1.message_,(HRSS_public_key *)(priv.opaque + 0x708));
    local_224c = HRSS_parse_public_key
                           ((HRSS_public_key *)local_1dbc,(uint8_t *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_2248,&local_224c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2248);
    if (!bVar1) {
      testing::Message::Message(&local_2258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)(ciphertext + 0x470),(internal *)local_2248,
                 (AssertionResult *)"HRSS_parse_public_key(&pub2, pub_bytes)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2260,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x9c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2260,&local_2258);
      testing::internal::AssertHelper::~AssertHelper(&local_2260);
      std::__cxx11::string::~string((string *)(ciphertext + 0x470));
      testing::Message::~Message(&local_2258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2248);
    if (bVar1) {
      local_272c = HRSS_encap(shared_key + 0x18,(uint8_t *)&gtest_ar__2.message_,
                              (HRSS_public_key *)local_1dbc,pub2.opaque + 0x58c);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_2728,&local_272c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2728);
      if (!bVar1) {
        testing::Message::Message(&local_2738);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2760,(internal *)local_2728,
                   (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy)",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2740,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2740,&local_2738);
        testing::internal::AssertHelper::~AssertHelper(&local_2740);
        std::__cxx11::string::~string((string *)&local_2760);
        testing::Message::~Message(&local_2738);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2728);
      if (bVar1) {
        local_279c = HRSS_decap((uint8_t *)&gtest_ar__3.message_,
                                (HRSS_private_key *)
                                ((long)&gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),shared_key + 0x18,0x472);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_2798,&local_279c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2798);
        if (!bVar1) {
          testing::Message::Message(&local_27a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_2798,
                     (AssertionResult *)
                     "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true"
                     ,in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_27b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0xa3,pcVar2);
          testing::internal::AssertHelper::operator=(&local_27b0,&local_27a8);
          testing::internal::AssertHelper::~AssertHelper(&local_27b0);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_27a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2798);
        if (bVar1) {
          bssl::Span<unsigned_char_const>::Span<32ul>
                    ((Span<unsigned_char_const> *)&local_2800,(uchar (*) [32])&gtest_ar__2.message_)
          ;
          Bytes::Bytes(&local_27f0,local_2800);
          bssl::Span<unsigned_char_const>::Span<32ul>
                    ((Span<unsigned_char_const> *)&local_2820,(uchar (*) [32])&gtest_ar__3.message_)
          ;
          Bytes::Bytes(&local_2810,local_2820);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_27e0,"Bytes(shared_key)","Bytes(shared_key2)",&local_27f0,
                     &local_2810);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_27e0);
          if (!bVar1) {
            testing::Message::Message(&local_2828);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_27e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2830,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xa5,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2830,&local_2828);
            testing::internal::AssertHelper::~AssertHelper(&local_2830);
            testing::Message::~Message(&local_2828);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_27e0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HRSS, Basic) {
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  for (unsigned i = 0; i < sizeof(generate_key_entropy); i++) {
    generate_key_entropy[i] = i;
  }

  HRSS_public_key pub;
  HRSS_private_key priv;
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  for (unsigned i = 0; i < sizeof(encap_entropy); i++) {
    encap_entropy[i] = i;
  }

  HRSS_public_key pub2;
  uint8_t pub_bytes[HRSS_PUBLIC_KEY_BYTES];
  HRSS_marshal_public_key(pub_bytes, &pub);
  ASSERT_TRUE(HRSS_parse_public_key(&pub2, pub_bytes));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy));

  uint8_t shared_key2[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));

  EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));
}